

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.h
# Opt level: O3

ostream * embree::operator<<(ostream *cout,Token *t)

{
  undefined8 in_RAX;
  long lVar1;
  size_type sVar2;
  char *pcVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  switch(t->ty) {
  case TY_EOF:
    pcVar3 = "eof";
    lVar1 = 3;
    goto LAB_001ab13c;
  case TY_CHAR:
    std::__ostream_insert<char,std::char_traits<char>>(cout,"Char(",5);
    pcVar3 = (char *)((long)&uStack_18 + 7);
    uStack_18 = CONCAT17((t->field_1).c,(undefined7)uStack_18);
    sVar2 = 1;
    goto LAB_001ab122;
  case TY_INT:
    std::__ostream_insert<char,std::char_traits<char>>(cout,"Int(",4);
    cout = (ostream *)std::ostream::operator<<((ostream *)cout,(t->field_1).i);
    break;
  case TY_FLOAT:
    std::__ostream_insert<char,std::char_traits<char>>(cout,"Float(",6);
    cout = std::ostream::_M_insert<double>((double)(t->field_1).f);
    break;
  case TY_IDENTIFIER:
    pcVar3 = "Id(";
    lVar1 = 3;
    goto LAB_001ab112;
  case TY_STRING:
    pcVar3 = "String(";
    goto LAB_001ab10d;
  case TY_SYMBOL:
    pcVar3 = "Symbol(";
LAB_001ab10d:
    lVar1 = 7;
LAB_001ab112:
    std::__ostream_insert<char,std::char_traits<char>>(cout,pcVar3,lVar1);
    pcVar3 = (t->str)._M_dataplus._M_p;
    sVar2 = (t->str)._M_string_length;
LAB_001ab122:
    cout = std::__ostream_insert<char,std::char_traits<char>>(cout,pcVar3,sVar2);
    break;
  default:
    pcVar3 = "unknown";
    lVar1 = 7;
    goto LAB_001ab13c;
  }
  pcVar3 = ")";
  lVar1 = 1;
LAB_001ab13c:
  std::__ostream_insert<char,std::char_traits<char>>(cout,pcVar3,lVar1);
  return cout;
}

Assistant:

std::ostream& operator<<(std::ostream& cout, const Token& t)
    {
      if (t.ty == TY_EOF) return cout << "eof";
      if (t.ty == TY_CHAR) return cout << "Char(" << t.c << ")";
      if (t.ty == TY_INT) return cout << "Int(" << t.i << ")";
      if (t.ty == TY_FLOAT) return cout << "Float(" << t.f << ")";
      if (t.ty == TY_IDENTIFIER) return cout << "Id(" << t.str << ")";
      if (t.ty == TY_STRING) return cout << "String(" << t.str << ")";
      if (t.ty == TY_SYMBOL) return cout << "Symbol(" << t.str << ")";
      return cout << "unknown";
    }